

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

uint32_t helper_vfp_toshh_aarch64(uint32_t x,uint32_t shift,void *fpst)

{
  int16_t iVar1;
  uint32_t uVar2;
  
  if (((ushort)x & 0x7fff) < 0x7c01) {
    iVar1 = float16_to_int16_scalbn_aarch64
                      ((ushort)x,(int)*(char *)((long)fpst + 1),shift,(float_status *)fpst);
    uVar2 = (uint32_t)iVar1;
  }
  else {
    float_raise_aarch64('\x01',(float_status *)fpst);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t HELPER(vfp_toshh)(uint32_t x, uint32_t shift, void *fpst)
{
    if (unlikely(float16_is_any_nan(x))) {
        float_raise(float_flag_invalid, fpst);
        return 0;
    }
    return float16_to_int16_scalbn(x, get_float_rounding_mode(fpst),
                                   shift, fpst);
}